

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.h
# Opt level: O2

ArrayView<const_Position> __thiscall
Corrade::Containers::
arrayCast<Corrade::Utility::Implementation::resourceLookup(unsigned_int,unsigned_int_const*,unsigned_char_const*,Corrade::Containers::BasicStringView<char_const>)::Position_const,unsigned_int_const>
          (Containers *this,ArrayView<const_unsigned_int> view)

{
  ostream *output;
  Debug *pDVar1;
  uint *value;
  ArrayView<const_Position> AVar2;
  Error EStack_38;
  
  value = view._data;
  if (((ulong)value >> 1) * 8 + (long)value * -4 == 0) {
    AVar2._size = (ulong)value >> 1 & 0x1fffffffffffffff;
    AVar2._data = (Position *)this;
    return AVar2;
  }
  output = Utility::Error::defaultOutput();
  Utility::Error::Error(&EStack_38,output,(Flags)0x0);
  pDVar1 = Utility::Debug::operator<<
                     (&EStack_38.super_Debug,"Containers::arrayCast(): can\'t reinterpret");
  pDVar1 = Utility::Debug::operator<<(pDVar1,(unsigned_long)value);
  pDVar1 = Utility::Debug::operator<<(pDVar1,4);
  (pDVar1->_immediateFlags)._value = (pDVar1->_immediateFlags)._value | 4;
  pDVar1 = Utility::Debug::operator<<(pDVar1,"-byte items into a");
  pDVar1 = Utility::Debug::operator<<(pDVar1,8);
  (pDVar1->_immediateFlags)._value = (pDVar1->_immediateFlags)._value | 4;
  Utility::Debug::operator<<(pDVar1,"-byte type");
  Utility::Error::~Error(&EStack_38);
  abort();
}

Assistant:

ArrayView<U> arrayCast(ArrayView<T> view) {
    static_assert(std::is_standard_layout<T>::value, "the source type is not standard layout");
    static_assert(std::is_standard_layout<U>::value, "the target type is not standard layout");
    const std::size_t size = view.size()*sizeof(T)/sizeof(U);
    /* Unlike slice() etc, this is usually not called in tight loops and should
       be as checked as possible, so it's not a debug assert */
    CORRADE_ASSERT(size*sizeof(U) == view.size()*sizeof(T),
        "Containers::arrayCast(): can't reinterpret" << view.size() << sizeof(T) << Utility::Debug::nospace << "-byte items into a" << sizeof(U) << Utility::Debug::nospace << "-byte type", {});
    return {reinterpret_cast<U*>(view.begin()), size};
}